

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiTiledPartThreading.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_206f3e::WritingTask::WritingTask
          (WritingTask *this,TaskGroup *group,TiledOutputPart *part,int lx,int ly,int startY,
          int numXTiles)

{
  IlmThread_3_4::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__Task_001ce378;
  this->part = part;
  this->lx = lx;
  this->ly = ly;
  this->startY = startY;
  this->numXTiles = numXTiles;
  return;
}

Assistant:

WritingTask (
        TaskGroup*       group,
        TiledOutputPart& part,
        int              lx,
        int              ly,
        int              startY,
        int              numXTiles)
        : Task (group)
        , part (part)
        , lx (lx)
        , ly (ly)
        , startY (startY)
        , numXTiles (numXTiles)
    {}